

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::fixColumn(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j,bool correctIdx)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int iVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  pointer pnVar7;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int32_t iVar8;
  int32_t iVar9;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  int *piVar16;
  bool *pbVar17;
  fpclass_type *pfVar18;
  FixVariablePS *this_02;
  undefined7 in_register_00000009;
  long lVar19;
  long lVar20;
  int32_t *piVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  pointer pnVar23;
  uint *puVar24;
  uint *puVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  long lVar29;
  long lVar30;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lp_00;
  long in_FS_OFFSET;
  byte bVar31;
  Real eps;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  undefined1 local_a08 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a00;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  uint local_9a8 [3];
  undefined3 uStack_99b;
  int iStack_998;
  bool abStack_994 [4];
  undefined8 local_990;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_980;
  Item *local_978;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_970;
  long local_968;
  undefined8 uStack_960;
  long local_950;
  undefined4 local_944;
  int local_940;
  int local_93c;
  cpp_dec_float<200U,_int,_void> local_938;
  long local_8b0;
  shared_ptr<soplex::Tolerances> local_8a8;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [13];
  undefined3 uStack_82b;
  int iStack_828;
  bool bStack_824;
  undefined8 local_820;
  long local_818;
  undefined8 uStack_810;
  long local_800;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [13];
  undefined3 uStack_78b;
  undefined5 uStack_788;
  undefined8 local_780;
  double local_778;
  undefined8 uStack_770;
  double local_768;
  undefined8 uStack_760;
  cpp_dec_float<200U,_int,_void> local_750;
  cpp_dec_float<200U,_int,_void> local_6d0;
  uint local_650 [28];
  cpp_dec_float<200U,_int,_void> local_5e0;
  cpp_dec_float<200U,_int,_void> local_560;
  cpp_dec_float<200U,_int,_void> local_4e0;
  cpp_dec_float<200U,_int,_void> local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e0;
  uint local_260 [28];
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar31 = 0;
  local_944 = (int)CONCAT71(in_register_00000009,correctIdx);
  local_940 = j;
  lVar29 = (long)j;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (uint *)(pnVar7 + lVar29);
  pcVar22 = &local_460;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pcVar22->data)._M_elems[0] = *puVar24;
    puVar24 = puVar24 + 1;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
  }
  local_6d0.exp = pnVar7[lVar29].m_backend.exp;
  local_460.exp = local_6d0.exp;
  local_6d0.neg = pnVar7[lVar29].m_backend.neg;
  local_460.neg = local_6d0.neg;
  local_6d0.fpclass = pnVar7[lVar29].m_backend.fpclass;
  local_460.fpclass = local_6d0.fpclass;
  local_6d0.prec_elem = pnVar7[lVar29].m_backend.prec_elem;
  local_460.prec_elem = local_6d0.prec_elem;
  pnVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (uint *)(pnVar7 + lVar29);
  puVar25 = local_650;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + 1;
    puVar25 = puVar25 + 1;
  }
  iVar15 = pnVar7[lVar29].m_backend.exp;
  bVar14 = pnVar7[lVar29].m_backend.neg;
  fVar2 = pnVar7[lVar29].m_backend.fpclass;
  local_800 = lVar29 * 0x80;
  iVar3 = pnVar7[lVar29].m_backend.prec_elem;
  local_980 = lp;
  local_978 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar29].idx;
  pcVar22 = &local_460;
  pcVar27 = &local_6d0;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
    pcVar27 = (cpp_dec_float<200U,_int,_void> *)((pcVar27->data)._M_elems + 1);
  }
  pcVar22 = &local_460;
  puVar24 = (uint *)&local_2e0;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar24 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((pcVar22->data)._M_elems + 1);
    puVar24 = puVar24 + 1;
  }
  local_2e0.m_backend.exp = local_6d0.exp;
  local_2e0.m_backend.neg = local_6d0.neg;
  local_2e0.m_backend.fpclass = local_6d0.fpclass;
  local_2e0.m_backend.prec_elem = local_6d0.prec_elem;
  puVar24 = local_650;
  puVar25 = (uint *)&local_360;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + 1;
    puVar25 = puVar25 + 1;
  }
  local_968 = CONCAT71(local_968._1_7_,bVar14);
  this_00 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_970 = this;
  local_360.m_backend.exp = iVar15;
  local_360.m_backend.neg = bVar14;
  local_360.m_backend.fpclass = fVar2;
  local_360.m_backend.prec_elem = iVar3;
  eps = Tolerances::epsilon(this_00);
  bVar14 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     (&local_2e0,&local_360,eps);
  lp_00 = local_980;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (bVar14) {
    local_820._0_4_ = cpp_dec_float_finite;
    local_820._4_4_ = 0x1c;
    iStack_828 = 0;
    bStack_824 = false;
    puVar24 = local_650;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_898;
    for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar24;
      puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
    }
    bStack_824 = (bool)(byte)local_968;
    local_820 = CONCAT44(iVar3,fVar2);
    iStack_828 = iVar15;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)local_898,&local_460);
    local_938.fpclass = cpp_dec_float_finite;
    local_938.prec_elem = 0x1c;
    local_938.data._M_elems[0] = 0;
    local_938.data._M_elems[1] = 0;
    local_938.data._M_elems[2] = 0;
    local_938.data._M_elems[3] = 0;
    local_938.data._M_elems[4] = 0;
    local_938.data._M_elems[5] = 0;
    local_938.data._M_elems[6] = 0;
    local_938.data._M_elems[7] = 0;
    local_938.data._M_elems[8] = 0;
    local_938.data._M_elems[9] = 0;
    local_938.data._M_elems[10] = 0;
    local_938.data._M_elems[0xb] = 0;
    local_938.data._M_elems[0xc] = 0;
    local_938.data._M_elems[0xd] = 0;
    local_938.data._M_elems[0xe] = 0;
    local_938.data._M_elems[0xf] = 0;
    local_938.data._M_elems[0x10] = 0;
    local_938.data._M_elems[0x11] = 0;
    local_938.data._M_elems[0x12] = 0;
    local_938.data._M_elems[0x13] = 0;
    local_938.data._M_elems[0x14] = 0;
    local_938.data._M_elems[0x15] = 0;
    local_938.data._M_elems[0x16] = 0;
    local_938.data._M_elems[0x17] = 0;
    local_938.data._M_elems[0x18] = 0;
    local_938.data._M_elems[0x19] = 0;
    local_938.data._M_elems._104_5_ = 0;
    local_938.data._M_elems[0x1b]._1_3_ = 0;
    local_938.exp = 0;
    local_938.neg = false;
    local_990._0_4_ = cpp_dec_float_finite;
    local_990._4_4_ = 0x1c;
    _local_a08 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  )ZEXT816(0);
    local_9f8 = ZEXT816(0);
    local_9e8 = ZEXT816(0);
    local_9d8 = ZEXT816(0);
    local_9c8 = ZEXT816(0);
    local_9b8 = ZEXT816(0);
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    stack0xfffffffffffff660 = 0;
    uStack_99b = 0;
    iStack_998 = 0;
    abStack_994[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_a08,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_938,(cpp_dec_float<200U,_int,_void> *)local_898,
               (cpp_dec_float<200U,_int,_void> *)local_a08);
    pcVar22 = &local_938;
    pcVar27 = &local_6d0;
    for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
      (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + ((ulong)bVar31 * -2 + 1) * 4);
    }
    local_6d0.exp = local_938.exp;
    local_6d0.neg = local_938.neg;
    local_6d0.fpclass = local_938.fpclass;
    local_6d0.prec_elem = local_938.prec_elem;
  }
  bVar14 = local_460.neg;
  iVar15 = local_460.exp;
  pcVar22 = &local_460;
  puVar24 = local_a0;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    *puVar24 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
    puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
  }
  lVar19 = CONCAT44(local_460.prec_elem,local_460.fpclass);
  uStack_960 = 0;
  local_968 = lVar19;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_4e0,local_970);
  puVar24 = local_a0;
  puVar25 = (uint *)local_a08;
  for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar31 * -2 + 1;
  }
  iStack_998 = iVar15;
  abStack_994[0] = bVar14;
  if ((bVar14 == true) && (local_a08._0_4_ != 0 || (int)local_968 != 0)) {
    abStack_994[0] = false;
  }
  local_990 = lVar19;
  if (((((int)local_968 != 2) && (local_4e0.fpclass != cpp_dec_float_NaN)) &&
      (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_a08,&local_4e0), 0 < iVar15)) &&
     (0 < (local_978->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused)) {
    local_768 = *(double *)(in_FS_OFFSET + -8);
    uStack_760 = 0;
    local_778 = -local_768;
    uStack_770 = 0x8000000000000000;
    lVar19 = 0;
    lVar29 = 0;
    do {
      lVar30 = (long)*(int *)((long)(&((local_978->data).
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem)->val + 1) + lVar19);
      pcVar22 = &(lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      local_968 = lVar29;
      local_8b0 = lVar30;
      ::soplex::infinity::__tls_init();
      local_990 = 0x1c00000000;
      local_a08 = (undefined1  [8])0x0;
      _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_9f8 = (undefined1  [16])0x0;
      local_9e8 = (undefined1  [16])0x0;
      local_9d8 = (undefined1  [16])0x0;
      local_9c8 = (undefined1  [16])0x0;
      local_9b8 = (undefined1  [16])0x0;
      local_9a8[0] = 0;
      local_9a8[1] = 0;
      stack0xfffffffffffff660 = 0;
      uStack_99b = 0;
      iStack_998 = 0;
      abStack_994[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_a08,local_768);
      if (((pcVar22->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_990 != cpp_dec_float_NaN)
          ) && (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_a08), iVar15 < 0
               )) {
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(((local_978->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem)->val).m_backend.data._M_elems + lVar19);
        local_820 = 0x1c00000000;
        local_898 = (undefined1  [16])0x0;
        local_888 = (undefined1  [16])0x0;
        local_878 = (undefined1  [16])0x0;
        local_868 = (undefined1  [16])0x0;
        local_858 = (undefined1  [16])0x0;
        local_848 = (undefined1  [16])0x0;
        local_838 = SUB1613((undefined1  [16])0x0,0);
        uStack_82b = 0;
        iStack_828 = 0;
        bStack_824 = false;
        pcVar22 = &local_6d0;
        if (pcVar27 != (cpp_dec_float<200U,_int,_void> *)local_898) {
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_898;
          for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
            (pcVar26->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar31 * -8 + 4);
          }
          iStack_828 = local_6d0.exp;
          bStack_824 = local_6d0.neg;
          local_820._0_4_ = local_6d0.fpclass;
          local_820._4_4_ = local_6d0.prec_elem;
          pcVar22 = pcVar27;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  ((cpp_dec_float<200U,_int,_void> *)local_898,pcVar22);
        lVar29 = local_820;
        bVar14 = bStack_824;
        iVar15 = iStack_828;
        pnVar7 = (lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar23 = pnVar7 + lVar30;
        puVar24 = local_110;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar24 = (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar31 * -2 + 1) * 4);
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        iVar4 = pnVar7[lVar30].m_backend.exp;
        bVar1 = pnVar7[lVar30].m_backend.neg;
        fVar5 = pnVar7[lVar30].m_backend.fpclass;
        iVar8 = pnVar7[lVar30].m_backend.prec_elem;
        puVar24 = local_110;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        iStack_998 = iVar4;
        abStack_994[0] = bVar1;
        local_990._0_4_ = fVar5;
        local_990._4_4_ = iVar8;
        if ((bVar1 == true) && (local_a08._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
          abStack_994[0] = false;
        }
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_898;
        pcVar27 = &local_938;
        for (lVar20 = 0x1c; lVar13 = local_820, lVar20 != 0; lVar20 = lVar20 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        local_938.exp = iVar15;
        local_938.neg = bVar14;
        local_820._0_4_ = (fpclass_type)lVar29;
        local_820._4_4_ = SUB84(lVar29,4);
        local_938.fpclass = (fpclass_type)local_820;
        local_938.prec_elem = local_820._4_4_;
        if ((bVar14 != false) && (local_938.data._M_elems[0] != 0 || (int)lVar29 != 0)) {
          local_938.neg = (bool)(bVar14 ^ 1);
        }
        local_820 = lVar13;
        if ((int)lVar29 == 2 || fVar5 == cpp_dec_float_NaN) {
          bVar14 = false;
        }
        else {
          iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_a08,&local_938);
          bVar14 = 0 < iVar15;
        }
        local_950 = lVar19;
        pcVar22 = &local_938;
        if (bVar14) {
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        }
        pcVar27 = &local_750;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        piVar16 = &local_938.exp;
        if (bVar14) {
          piVar16 = &iStack_998;
        }
        local_750.exp = *piVar16;
        pbVar17 = &local_938.neg;
        if (bVar14) {
          pbVar17 = abStack_994;
        }
        local_750.neg = *pbVar17;
        pfVar18 = &local_938.fpclass;
        if (bVar14) {
          pfVar18 = (fpclass_type *)&local_990;
        }
        piVar21 = &local_938.prec_elem;
        if (bVar14) {
          piVar21 = (int32_t *)((long)&local_990 + 4);
        }
        local_750.fpclass = *pfVar18;
        local_750.prec_elem = *piVar21;
        if (*pfVar18 != cpp_dec_float_NaN) {
          local_990._0_4_ = cpp_dec_float_finite;
          local_990._4_4_ = 0x1c;
          local_a08 = (undefined1  [8])0x0;
          _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_9f8 = (undefined1  [16])0x0;
          local_9e8 = (undefined1  [16])0x0;
          local_9d8 = (undefined1  [16])0x0;
          local_9c8 = (undefined1  [16])0x0;
          local_9b8 = (undefined1  [16])0x0;
          local_9a8[0] = 0;
          local_9a8[1] = 0;
          stack0xfffffffffffff660 = 0;
          uStack_99b = 0;
          iStack_998 = 0;
          abStack_994[0] = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_a08,1.0);
          iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_750,(cpp_dec_float<200U,_int,_void> *)local_a08);
          if (iVar15 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_750,1.0);
          }
        }
        local_990 = 0x1c00000000;
        local_a08 = (undefined1  [8])0x0;
        _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_9f8 = (undefined1  [16])0x0;
        local_9e8 = (undefined1  [16])0x0;
        local_9d8 = (undefined1  [16])0x0;
        local_9c8 = (undefined1  [16])0x0;
        local_9b8 = (undefined1  [16])0x0;
        local_9a8[0] = 0;
        local_9a8[1] = 0;
        stack0xfffffffffffff660 = 0;
        uStack_99b = 0;
        iStack_998 = 0;
        abStack_994[0] = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_a08,
                   &(lp_00->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,&local_750);
        local_780._0_4_ = cpp_dec_float_finite;
        local_780._4_4_ = 0x1c;
        local_7f8 = (undefined1  [16])0x0;
        local_7e8 = (undefined1  [16])0x0;
        local_7d8 = (undefined1  [16])0x0;
        local_7c8 = (undefined1  [16])0x0;
        local_7b8 = (undefined1  [16])0x0;
        local_7a8 = (undefined1  [16])0x0;
        local_798 = SUB1613((undefined1  [16])0x0,0);
        uStack_78b = 0;
        uStack_788._0_4_ = 0;
        uStack_788._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_7f8,
                   (cpp_dec_float<200U,_int,_void> *)local_898,&local_750);
        local_938.fpclass = cpp_dec_float_finite;
        local_938.prec_elem = 0x1c;
        local_938.neg = false;
        local_938.exp = 0;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        pcVar27 = &local_938;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
        }
        local_938.exp = iStack_998;
        local_938.neg = abStack_994[0];
        local_938.fpclass = (fpclass_type)local_990;
        local_938.prec_elem = local_990._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_938,(cpp_dec_float<200U,_int,_void> *)local_7f8);
        uVar11 = local_938._120_8_;
        bVar14 = local_938.neg;
        pcVar22 = &local_938;
        puVar24 = local_180;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar24 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        local_93c = local_938.exp;
        local_818._0_4_ = local_938.fpclass;
        local_818._4_4_ = local_938.prec_elem;
        uStack_810 = 0;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_560,local_970);
        puVar24 = local_180;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
        for (lVar29 = 0x1c; uVar12 = local_938._120_8_, lVar19 = local_950, lVar29 != 0;
            lVar29 = lVar29 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar24;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        iStack_998 = local_93c;
        abStack_994[0] = bVar14;
        local_938.fpclass = (fpclass_type)uVar11;
        local_938.prec_elem = SUB84(uVar11,4);
        local_990._0_4_ = local_938.fpclass;
        local_990._4_4_ = local_938.prec_elem;
        if ((bVar14 == true) && (local_a08._0_4_ != 0 || (int)local_818 != 0)) {
          abStack_994[0] = false;
        }
        local_938._120_8_ = uVar12;
        if (((int)local_818 == 2) || (local_560.fpclass == cpp_dec_float_NaN)) {
LAB_00581481:
          lp_00 = local_980;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_938,&local_750);
        }
        else {
          iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_a08,&local_560);
          lp_00 = local_980;
          if (0 < iVar15) goto LAB_00581481;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_938,0.0);
        }
        (*(lp_00->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(lp_00,local_8b0,&local_938,0);
      }
      pcVar22 = &(lp_00->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      ::soplex::infinity::__tls_init();
      local_990 = 0x1c00000000;
      local_a08 = (undefined1  [8])0x0;
      _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_9f8 = (undefined1  [16])0x0;
      local_9e8 = (undefined1  [16])0x0;
      local_9d8 = (undefined1  [16])0x0;
      local_9c8 = (undefined1  [16])0x0;
      local_9b8 = (undefined1  [16])0x0;
      local_9a8[0] = 0;
      local_9a8[1] = 0;
      stack0xfffffffffffff660 = 0;
      uStack_99b = 0;
      iStack_998 = 0;
      abStack_994[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_a08,local_778);
      if ((pcVar22->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_990 != cpp_dec_float_NaN))
      {
        iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_a08);
        if (0 < iVar15) {
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)(((local_978->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar19);
          local_820 = 0x1c00000000;
          local_898 = (undefined1  [16])0x0;
          local_888 = (undefined1  [16])0x0;
          local_878 = (undefined1  [16])0x0;
          local_868 = (undefined1  [16])0x0;
          local_858 = (undefined1  [16])0x0;
          local_848 = (undefined1  [16])0x0;
          local_838 = SUB1613((undefined1  [16])0x0,0);
          uStack_82b = 0;
          iStack_828 = 0;
          bStack_824 = false;
          pcVar22 = &local_6d0;
          if (pcVar27 != (cpp_dec_float<200U,_int,_void> *)local_898) {
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_898;
            for (lVar29 = 0x1c; lVar29 != 0; lVar29 = lVar29 + -1) {
              (pcVar26->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar31 * -8 + 4);
            }
            iStack_828 = local_6d0.exp;
            bStack_824 = local_6d0.neg;
            local_820._0_4_ = local_6d0.fpclass;
            local_820._4_4_ = local_6d0.prec_elem;
            pcVar22 = pcVar27;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_898,pcVar22);
          lVar29 = local_820;
          bVar14 = bStack_824;
          iVar15 = iStack_828;
          pnVar7 = (lp_00->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar23 = pnVar7 + lVar30;
          puVar24 = local_1f0;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            *puVar24 = (pnVar23->m_backend).data._M_elems[0];
            pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar31 * -2 + 1) * 4);
            puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
          }
          iVar4 = pnVar7[lVar30].m_backend.exp;
          bVar1 = pnVar7[lVar30].m_backend.neg;
          fVar6 = pnVar7[lVar30].m_backend.fpclass;
          iVar9 = pnVar7[lVar30].m_backend.prec_elem;
          puVar24 = local_1f0;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
          for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pcVar22->data)._M_elems[0] = *puVar24;
            puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          }
          iStack_998 = iVar4;
          abStack_994[0] = bVar1;
          local_990._0_4_ = fVar6;
          local_990._4_4_ = iVar9;
          if ((bVar1 == true) && (local_a08._0_4_ != 0 || fVar6 != cpp_dec_float_finite)) {
            abStack_994[0] = false;
          }
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_898;
          pcVar27 = &local_938;
          for (lVar20 = 0x1c; lVar13 = local_820, lVar20 != 0; lVar20 = lVar20 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
          }
          local_938.exp = iVar15;
          local_938.neg = bVar14;
          local_820._0_4_ = (fpclass_type)lVar29;
          local_820._4_4_ = SUB84(lVar29,4);
          local_938.fpclass = (fpclass_type)local_820;
          local_938.prec_elem = local_820._4_4_;
          if ((bVar14 != false) && (local_938.data._M_elems[0] != 0 || (int)lVar29 != 0)) {
            local_938.neg = (bool)(bVar14 ^ 1);
          }
          local_820 = lVar13;
          if ((int)lVar29 == 2 || fVar6 == cpp_dec_float_NaN) {
            bVar14 = false;
          }
          else {
            iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_a08,&local_938);
            bVar14 = 0 < iVar15;
          }
          local_950 = lVar19;
          pcVar22 = &local_938;
          if (bVar14) {
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
          }
          pcVar27 = &local_750;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
          }
          piVar16 = &local_938.exp;
          if (bVar14) {
            piVar16 = &iStack_998;
          }
          local_750.exp = *piVar16;
          pbVar17 = &local_938.neg;
          if (bVar14) {
            pbVar17 = abStack_994;
          }
          local_750.neg = *pbVar17;
          pfVar18 = &local_938.fpclass;
          if (bVar14) {
            pfVar18 = (fpclass_type *)&local_990;
          }
          piVar21 = &local_938.prec_elem;
          if (bVar14) {
            piVar21 = (int32_t *)((long)&local_990 + 4);
          }
          local_750.fpclass = *pfVar18;
          local_750.prec_elem = *piVar21;
          if (*pfVar18 != cpp_dec_float_NaN) {
            local_990._0_4_ = cpp_dec_float_finite;
            local_990._4_4_ = 0x1c;
            local_a08 = (undefined1  [8])0x0;
            _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_9f8 = (undefined1  [16])0x0;
            local_9e8 = (undefined1  [16])0x0;
            local_9d8 = (undefined1  [16])0x0;
            local_9c8 = (undefined1  [16])0x0;
            local_9b8 = (undefined1  [16])0x0;
            local_9a8[0] = 0;
            local_9a8[1] = 0;
            stack0xfffffffffffff660 = 0;
            uStack_99b = 0;
            iStack_998 = 0;
            abStack_994[0] = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_a08,1.0);
            iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_750,(cpp_dec_float<200U,_int,_void> *)local_a08);
            if (iVar15 < 0) {
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_750,1.0);
            }
          }
          local_990 = 0x1c00000000;
          local_a08 = (undefined1  [8])0x0;
          _Stack_a00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_9f8 = (undefined1  [16])0x0;
          local_9e8 = (undefined1  [16])0x0;
          local_9d8 = (undefined1  [16])0x0;
          local_9c8 = (undefined1  [16])0x0;
          local_9b8 = (undefined1  [16])0x0;
          local_9a8[0] = 0;
          local_9a8[1] = 0;
          stack0xfffffffffffff660 = 0;
          uStack_99b = 0;
          iStack_998 = 0;
          abStack_994[0] = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_a08,
                     &(lp_00->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,&local_750);
          local_780._0_4_ = cpp_dec_float_finite;
          local_780._4_4_ = 0x1c;
          local_7f8 = (undefined1  [16])0x0;
          local_7e8 = (undefined1  [16])0x0;
          local_7d8 = (undefined1  [16])0x0;
          local_7c8 = (undefined1  [16])0x0;
          local_7b8 = (undefined1  [16])0x0;
          local_7a8 = (undefined1  [16])0x0;
          local_798 = SUB1613((undefined1  [16])0x0,0);
          uStack_78b = 0;
          uStack_788._0_4_ = 0;
          uStack_788._4_1_ = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_7f8,
                     (cpp_dec_float<200U,_int,_void> *)local_898,&local_750);
          local_938.fpclass = cpp_dec_float_finite;
          local_938.prec_elem = 0x1c;
          local_938.neg = false;
          local_938.exp = 0;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
          pcVar27 = &local_938;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar31 * -8 + 4);
          }
          local_938.exp = iStack_998;
          local_938.neg = abStack_994[0];
          local_938.fpclass = (fpclass_type)local_990;
          local_938.prec_elem = local_990._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_938,(cpp_dec_float<200U,_int,_void> *)local_7f8);
          uVar11 = local_938._120_8_;
          bVar14 = local_938.neg;
          iVar15 = local_938.exp;
          pcVar22 = &local_938;
          puVar24 = local_260;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            *puVar24 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
          }
          local_818._0_4_ = local_938.fpclass;
          local_818._4_4_ = local_938.prec_elem;
          uStack_810 = 0;
          epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_5e0,local_970);
          puVar24 = local_260;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a08;
          for (lVar29 = 0x1c; uVar12 = local_938._120_8_, lVar19 = local_950, lVar29 != 0;
              lVar29 = lVar29 + -1) {
            (pcVar22->data)._M_elems[0] = *puVar24;
            puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          }
          iStack_998 = iVar15;
          abStack_994[0] = bVar14;
          local_938.fpclass = (fpclass_type)uVar11;
          local_938.prec_elem = SUB84(uVar11,4);
          local_990._0_4_ = local_938.fpclass;
          local_990._4_4_ = local_938.prec_elem;
          if ((bVar14 == true) && (local_a08._0_4_ != 0 || (int)local_818 != 0)) {
            abStack_994[0] = false;
          }
          local_938._120_8_ = uVar12;
          if (((int)local_818 == 2) || (local_5e0.fpclass == cpp_dec_float_NaN)) {
LAB_00581abf:
            lp_00 = local_980;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_938,&local_750);
          }
          else {
            iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_a08,&local_5e0);
            lp_00 = local_980;
            if (0 < iVar15) goto LAB_00581abf;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_938,0.0);
          }
          (*(lp_00->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(lp_00,local_8b0,&local_938,0);
        }
      }
      lVar29 = local_968 + 1;
      lVar19 = lVar19 + 0x84;
    } while (lVar29 < (local_978->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  this_02 = (FixVariablePS *)operator_new(600);
  pSVar10 = local_970;
  pnVar7 = (lp_00->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar24 = (uint *)((long)(pnVar7->m_backend).data._M_elems + local_800);
  pnVar28 = &local_3e0;
  for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
    (pnVar28->m_backend).data._M_elems[0] = *puVar24;
    puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + ((ulong)bVar31 * -2 + 1) * 4);
  }
  local_3e0.m_backend.exp = *(int *)((long)(&(pnVar7->m_backend).data + 1) + local_800);
  local_3e0.m_backend.neg = *(bool *)((long)(&(pnVar7->m_backend).data + 1) + local_800 + 4U);
  local_3e0.m_backend._120_8_ =
       *(undefined8 *)((long)(&(pnVar7->m_backend).data + 1) + local_800 + 8U);
  local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (local_970->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (local_970->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  FixVariablePS::FixVariablePS
            (this_02,lp_00,local_970,local_940,&local_3e0,&local_8a8,SUB41(local_944,0));
  local_a08 = (undefined1  [8])this_02;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a08 + 8),this_02);
  if (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(pSVar10->m_hist).data,(value_type *)local_a08);
  if (_Stack_a00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a00._M_pi);
  }
  return;
}

Assistant:

void SPxMainSM<R>::fixColumn(SPxLPBase<R>& lp, int j, bool correctIdx)
{

   assert(EQrel(lp.lower(j), lp.upper(j), feastol()));

   R lo            = lp.lower(j);
   R up            = lp.upper(j);
   const SVectorBase<R>& col = lp.colVector(j);
   R mid           = lo;

   // use the center value between slightly different bounds to improve numerics
   if(NE(lo, up, this->tolerances()->epsilon()))
      mid = (up + lo) / 2.0;

   assert(lo < R(infinity) && lo > R(-infinity));
   assert(up < R(infinity) && up > R(-infinity));

   SPxOut::debug(this, "IMAISM66 fix variable x{}: lower={} upper={} to new value: {}\n", j, lo, up,
                 mid);

   if(isNotZero(lo, this->epsZero()))
   {
      for(int k = 0; k < col.size(); ++k)
      {
         int i = col.index(k);

         if(lp.rhs(i) < R(infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.rhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R rhs = (lp.rhs(i) / scale) - (y / scale);

            if(isZero(rhs, this->epsZero()))
               rhs = 0.0;
            else
               rhs *= scale;

            SPxOut::debug(this, "IMAISM67 row {}: rhs={} ({}) aij={}\n", i, rhs, lp.rhs(i), col.value(k));

            lp.changeRhs(i, rhs);
         }

         if(lp.lhs(i) > R(-infinity))
         {
            R y     = mid * col.value(k);
            R scale = maxAbs(lp.lhs(i), y);

            if(scale < 1.0)
               scale = 1.0;

            R lhs = (lp.lhs(i) / scale) - (y / scale);

            if(isZero(lhs, this->epsZero()))
               lhs = 0.0;
            else
               lhs *= scale;

            SPxOut::debug(this, "IMAISM68 row {}: lhs={} ({}) aij={}\n", i, lhs, lp.lhs(i), col.value(k));

            lp.changeLhs(i, lhs);
         }

         assert(lp.lhs(i) <= lp.rhs(i) + feastol());
      }
   }

   std::shared_ptr<PostStep> ptr(new FixVariablePS(lp, *this, j, lp.lower(j), this->_tolerances,
                                 correctIdx));
   m_hist.append(ptr);
}